

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttribKernelT.hh
# Opt level: O0

void __thiscall
OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
request_face_normals
          (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this
          )

{
  uint uVar1;
  allocator local_31;
  string local_30 [32];
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *local_10;
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this_local;
  
  uVar1 = this->refcount_fnormals_;
  this->refcount_fnormals_ = uVar1 + 1;
  if (uVar1 == 0) {
    local_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"f:normals",&local_31);
    BaseKernel::add_property<OpenMesh::VectorT<double,3>>
              ((BaseKernel *)this,&this->face_normals_,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void request_face_normals()
  {
    if (!refcount_fnormals_++)
      this->add_property( face_normals_, "f:normals" );
  }